

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_cluster.cpp
# Opt level: O1

void __thiscall argparse::args_t::parse_ambig(args_t *this,char *str)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  
  iVar1 = strcmp(str,"resolve");
  if (iVar1 == 0) {
    this->ambig = resolve;
  }
  else {
    iVar1 = strcmp(str,"average");
    if (iVar1 == 0) {
      this->ambig = average;
    }
    else {
      iVar1 = strcmp(str,"skip");
      if (iVar1 == 0) {
        this->ambig = skip;
      }
      else {
        iVar1 = strcmp(str,"gapmm");
        if (iVar1 != 0) {
          this->ambig = subset;
          sVar2 = strlen(str);
          __dest = (char *)operator_new__(sVar2 + 1);
          this->ambigs_to_resolve = __dest;
          strcpy(__dest,str);
          return;
        }
        this->ambig = gapmm;
      }
    }
  }
  return;
}

Assistant:

void args_t::parse_ambig( const char * str ) {
        if (!strcmp (str, "resolve")) {
            ambig = resolve;
        } else if (!strcmp (str, "average")) {
            ambig = average;
        } else if (!strcmp (str, "skip")) {
            ambig = skip;
        } else if (!strcmp (str, "gapmm")) {
            ambig = gapmm;
        } else {
            ambig = subset;
            ambigs_to_resolve = new char [strlen (str) + 1];
            strcpy (ambigs_to_resolve, str);
        }
    }